

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

LocalFunctionId __thiscall Js::FunctionProxy::GetLocalFunctionId(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  return pFVar4->functionId;
}

Assistant:

inline Js::LocalFunctionId FunctionProxy::GetLocalFunctionId() const
    {
        Assert(GetFunctionInfo());
        return GetFunctionInfo()->GetLocalFunctionId();
    }